

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

bool tinyusdz::is_close(matrix3d *a,matrix3d *b,double eps)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = a->m[0][0];
  dVar1 = b->m[0][0];
  dVar4 = ABS(dVar3 - dVar1);
  if (dVar4 <= eps) {
LAB_002a1b5d:
    dVar3 = a->m[0][1];
    dVar1 = b->m[0][1];
    dVar4 = ABS(dVar3 - dVar1);
    if (eps < dVar4) {
      dVar3 = fmax(ABS(dVar3),ABS(dVar1));
      if (dVar3 * eps < dVar4) goto LAB_002a1d93;
    }
    dVar3 = a->m[0][2];
    dVar1 = b->m[0][2];
    dVar4 = ABS(dVar3 - dVar1);
    if (eps < dVar4) {
      dVar3 = fmax(ABS(dVar3),ABS(dVar1));
      if (dVar3 * eps < dVar4) goto LAB_002a1d93;
    }
    dVar3 = a->m[1][0];
    dVar1 = b->m[1][0];
    dVar4 = ABS(dVar3 - dVar1);
    if (eps < dVar4) {
      dVar3 = fmax(ABS(dVar3),ABS(dVar1));
      if (dVar3 * eps < dVar4) goto LAB_002a1d93;
    }
    dVar3 = a->m[1][1];
    dVar1 = b->m[1][1];
    dVar4 = ABS(dVar3 - dVar1);
    if (eps < dVar4) {
      dVar3 = fmax(ABS(dVar3),ABS(dVar1));
      if (dVar3 * eps < dVar4) goto LAB_002a1d93;
    }
    dVar3 = a->m[1][2];
    dVar1 = b->m[1][2];
    dVar4 = ABS(dVar3 - dVar1);
    if (eps < dVar4) {
      dVar3 = fmax(ABS(dVar3),ABS(dVar1));
      if (dVar3 * eps < dVar4) goto LAB_002a1d93;
    }
    dVar3 = a->m[2][0];
    dVar1 = b->m[2][0];
    dVar4 = ABS(dVar3 - dVar1);
    if (eps < dVar4) {
      dVar3 = fmax(ABS(dVar3),ABS(dVar1));
      if (dVar3 * eps < dVar4) goto LAB_002a1d93;
    }
    dVar3 = a->m[2][1];
    dVar1 = b->m[2][1];
    dVar4 = ABS(dVar3 - dVar1);
    if (eps < dVar4) {
      dVar3 = fmax(ABS(dVar3),ABS(dVar1));
      if (dVar3 * eps < dVar4) goto LAB_002a1d93;
    }
    dVar3 = a->m[2][2];
    dVar1 = b->m[2][2];
    dVar4 = ABS(dVar3 - dVar1);
    bVar2 = true;
    if (eps < dVar4) {
      dVar3 = fmax(ABS(dVar3),ABS(dVar1));
      bVar2 = dVar4 <= dVar3 * eps;
    }
  }
  else {
    dVar3 = fmax(ABS(dVar3),ABS(dVar1));
    if (dVar4 <= dVar3 * eps) goto LAB_002a1b5d;
LAB_002a1d93:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool is_close(const value::matrix3d &a, const value::matrix3d &b, const double eps) {
  return math::is_close(a.m[0][0], b.m[0][0], eps) &&
         math::is_close(a.m[0][1], b.m[0][1], eps) &&
         math::is_close(a.m[0][2], b.m[0][2], eps) &&
         math::is_close(a.m[1][0], b.m[1][0], eps) &&
         math::is_close(a.m[1][1], b.m[1][1], eps) &&
         math::is_close(a.m[1][2], b.m[1][2], eps) &&
         math::is_close(a.m[2][0], b.m[2][0], eps) &&
         math::is_close(a.m[2][1], b.m[2][1], eps) &&
         math::is_close(a.m[2][2], b.m[2][2], eps);
}